

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::TrigramInfo::TrigramInfo(TrigramInfo *this,char *pat1,char *pat2,Recycler *recycler)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  memset(this->cachedResult,0,0x100);
  this->isTrigramPattern = true;
  this->hasCachedResultString = false;
  this->triPat1 = 0;
  this->triPat2 = 0;
  this->resultCount = 0;
  lVar1 = 3;
  iVar2 = 0;
  do {
    iVar3 = iVar3 * 0x10 + (int)pat1[lVar1];
    this->triPat1 = iVar3;
    iVar2 = iVar2 * 0x10 + (int)pat2[lVar1];
    this->triPat2 = iVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

TrigramInfo::TrigramInfo(__in_ecount(PatternLength) char* pat1,__in_ecount(PatternLength) char* pat2, Recycler* recycler)
    {
        isTrigramPattern=true;
        hasCachedResultString = false;

        int k;
        triPat1=0;
        triPat2=0;
        resultCount=0;
        for (k=3;k<PatternLength;k++) {
            triPat1=(triPat1<<4)+pat1[k];
            triPat2=(triPat2<<4)+pat2[k];
        }
    }